

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void get_var_sse_sum_8x8_quad_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,uint32_t *sse8x8,
               int *sum8x8,uint *tot_sse,int *tot_sum,uint32_t *var8x8)

{
  __m256i set_one_minusone_00;
  int in_ECX;
  __m256i *in_RDX;
  undefined4 in_ESI;
  int in_R8D;
  undefined1 (*in_R9) [16];
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 (*in_stack_00000008) [16];
  __m128i sum_temp8x8;
  __m256i sum_sse_order_add;
  int i;
  __m256i set_one_minusone;
  __m256i sum_8x16 [2];
  __m256i sse_8x16 [2];
  undefined8 local_330;
  undefined8 uStackY_328;
  int local_2c4;
  __m256i *sum_8x16_00;
  __m256i *sse_8x16_00;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  longlong lVar8;
  uint8_t *ref_00;
  uint8_t *src_00;
  undefined4 in_stack_fffffffffffffe10;
  
  uVar6 = 0;
  uVar7 = 0;
  lVar8 = 0;
  sum_8x16_00 = (__m256i *)0x0;
  sse_8x16_00 = (__m256i *)0x0;
  uVar5 = 0;
  ref_00 = (uint8_t *)0x0;
  src_00 = (uint8_t *)0x0;
  auVar2 = vpinsrw_avx(ZEXT216(0xff01),0xff01,1);
  auVar2 = vpinsrw_avx(auVar2,0xff01,2);
  auVar2 = vpinsrw_avx(auVar2,0xff01,3);
  auVar2 = vpinsrw_avx(auVar2,0xff01,4);
  auVar2 = vpinsrw_avx(auVar2,0xff01,5);
  auVar2 = vpinsrw_avx(auVar2,0xff01,6);
  auVar2 = vpinsrw_avx(auVar2,0xff01,7);
  auVar4 = vpinsrw_avx(ZEXT216(0xff01),0xff01,1);
  auVar4 = vpinsrw_avx(auVar4,0xff01,2);
  auVar4 = vpinsrw_avx(auVar4,0xff01,3);
  auVar4 = vpinsrw_avx(auVar4,0xff01,4);
  auVar4 = vpinsrw_avx(auVar4,0xff01,5);
  auVar4 = vpinsrw_avx(auVar4,0xff01,6);
  auVar4 = vpinsrw_avx(auVar4,0xff01,7);
  auVar1 = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
  auVar3 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar2 = auVar1;
  auVar4 = auVar3;
  for (local_2c4 = 0; local_2c4 < in_R8D; local_2c4 = local_2c4 + 1) {
    set_one_minusone_00[1] = uVar6;
    set_one_minusone_00[0] = uVar5;
    set_one_minusone_00[2] = uVar7;
    set_one_minusone_00[3] = lVar8;
    auVar2 = auVar1;
    auVar4 = auVar3;
    calc_sum_sse_wd32_avx2(src_00,ref_00,set_one_minusone_00,sse_8x16_00,sum_8x16_00);
    in_RDX = (__m256i *)((long)*in_RDX + (long)in_ECX);
  }
  calc_sum_sse_order((__m256i *)CONCAT44(in_ESI,in_stack_fffffffffffffe10),in_RDX,
                     (uint *)CONCAT44(in_ECX,in_R8D),(int *)in_R9);
  *in_R9 = auVar2;
  *in_stack_00000008 = auVar4;
  auVar4 = vpmulld_avx(auVar4,auVar4);
  auVar4 = vpsrld_avx(auVar4,ZEXT416(6));
  auVar2 = vpsubd_avx(auVar2,auVar4);
  local_330 = auVar2._0_8_;
  uStackY_328 = auVar2._8_8_;
  *(undefined8 *)tot_sum = local_330;
  *(undefined8 *)(tot_sum + 2) = uStackY_328;
  return;
}

Assistant:

static inline void get_var_sse_sum_8x8_quad_avx2(
    const uint8_t *src, int src_stride, const uint8_t *ref,
    const int ref_stride, const int h, uint32_t *sse8x8, int *sum8x8,
    unsigned int *tot_sse, int *tot_sum, uint32_t *var8x8) {
  assert(h <= 128);  // May overflow for larger height.
  __m256i sse_8x16[2], sum_8x16[2];
  sum_8x16[0] = _mm256_setzero_si256();
  sse_8x16[0] = _mm256_setzero_si256();
  sum_8x16[1] = sum_8x16[0];
  sse_8x16[1] = sse_8x16[0];
  const __m256i set_one_minusone = _mm256_set1_epi16((short)0xff01);

  for (int i = 0; i < h; i++) {
    // Process 8x32 block of one row.
    calc_sum_sse_wd32_avx2(src, ref, set_one_minusone, sse_8x16, sum_8x16);
    src += src_stride;
    ref += ref_stride;
  }

  const __m256i sum_sse_order_add =
      calc_sum_sse_order(sse_8x16, sum_8x16, tot_sse, tot_sum);

  // s0 s1 s2 s3
  _mm_storeu_si128((__m128i *)sse8x8,
                   _mm256_castsi256_si128(sum_sse_order_add));
  // d0 d1 d2 d3
  const __m128i sum_temp8x8 = _mm256_extractf128_si256(sum_sse_order_add, 1);
  _mm_storeu_si128((__m128i *)sum8x8, sum_temp8x8);

  // (d0xd0 >> 6)=f0 (d1xd1 >> 6)=f1 (d2xd2 >> 6)=f2 (d3xd3 >> 6)=f3
  const __m128i mull_results =
      _mm_srli_epi32(_mm_mullo_epi32(sum_temp8x8, sum_temp8x8), 6);
  // s0-f0=v0 s1-f1=v1 s2-f2=v2 s3-f3=v3
  const __m128i variance_8x8 =
      _mm_sub_epi32(_mm256_castsi256_si128(sum_sse_order_add), mull_results);
  // v0 v1 v2 v3
  _mm_storeu_si128((__m128i *)var8x8, variance_8x8);
}